

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::NoAssertionsInSection(BasicReporter *this,string *sectionName)

{
  ostream *poVar1;
  Colour colour;
  
  startSpansLazily(this);
  Colour::Colour(&colour,BrightRed);
  poVar1 = std::operator<<((this->m_config).m_stream,"\nNo assertions in section, \'");
  poVar1 = std::operator<<(poVar1,(string *)sectionName);
  poVar1 = std::operator<<(poVar1,"\'\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  Colour::~Colour(&colour);
  return;
}

Assistant:

virtual void NoAssertionsInSection( const std::string& sectionName ) {
            startSpansLazily();
            Colour colour( Colour::ResultError );
            m_config.stream() << "\nNo assertions in section, '" << sectionName << "'\n" << std::endl;
        }